

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::GetNode
          (TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_> *this,
          FName *key)

{
  Node *pNVar1;
  Node *pNVar2;
  FName local_4;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key->Index);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key.Index == key->Index) {
LAB_0030fd17:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,&local_4);
      }
      return pNVar2;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_0030fd17;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}